

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value_parser.cc
# Opt level: O0

void __thiscall
iqxmlrpc::anon_unknown_7::ArrayBuilder::ArrayBuilder(ArrayBuilder *this,Parser *parser)

{
  Array *this_00;
  Parser *parser_local;
  ArrayBuilder *this_local;
  
  ValueBuilderBase::ValueBuilderBase(&this->super_ValueBuilderBase,parser,false);
  (this->super_ValueBuilderBase).super_BuilderBase._vptr_BuilderBase =
       (_func_int **)&PTR_do_visit_element_00254bd8;
  StateMachine::StateMachine(&this->state_,parser,0);
  this->proxy_ = (Array *)0x0;
  StateMachine::set_transitions(&this->state_,ArrayBuilder::trans);
  this_00 = (Array *)operator_new(0x20);
  Array::Array(this_00);
  this->proxy_ = this_00;
  std::auto_ptr<iqxmlrpc::Value_type>::reset
            (&(this->super_ValueBuilderBase).retval,(element_type *)this_00);
  return;
}

Assistant:

ArrayBuilder(Parser& parser):
    ValueBuilderBase(parser),
    state_(parser, NONE),
    proxy_(0)
  {
    static const StateMachine::StateTransition trans[] = {
      { NONE, DATA, "data" },
      { DATA, VALUES, "value" },
      { VALUES, VALUES, "value" },
      { 0, 0, 0 }
    };
    state_.set_transitions(trans);
    retval.reset(proxy_ = new Array());
  }